

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_cv_alloc(nng_cv **cvp,nng_mtx *mx)

{
  int iVar1;
  nni_cv *cv;
  
  cv = (nni_cv *)nni_zalloc(0x38);
  if (cv == (nni_cv *)0x0) {
    iVar1 = 2;
  }
  else {
    nni_cv_init(cv,&mx->m);
    *cvp = (nng_cv *)cv;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_cv_alloc(nng_cv **cvp, nng_mtx *mx)
{
	nng_cv *cv;

	if ((cv = NNI_ALLOC_STRUCT(cv)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_cv_init(&cv->c, &mx->m);
	*cvp = cv;
	return (0);
}